

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

void __thiscall
QHttpHeaders::setDateTimeValue(QHttpHeaders *this,QAnyStringView name,QDateTime *dateTime)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QDateTime::isValid();
  if (cVar1 == '\0') {
    setDateTimeValue();
  }
  else {
    QNetworkHeadersPrivate::toHttpDate((QByteArray *)local_48,dateTime);
    replaceOrAppend(this,name,(QAnyStringView)local_48._8_16_);
    if ((QArrayData *)local_48._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeaders::setDateTimeValue(QAnyStringView name, const QDateTime &dateTime)
{
    if (!dateTime.isValid()) {
        qWarning("QHttpHeaders::setDateTimeValue: invalid QDateTime value received");
        return;
    }
    replaceOrAppend(name, QNetworkHeadersPrivate::toHttpDate(dateTime));
}